

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_server.h
# Opt level: O0

void __thiscall
blcl::net::server_interface<MsgType>::server_interface
          (server_interface<MsgType> *this,uint16_t port)

{
  tcp local_44;
  basic_endpoint<asio::ip::tcp> local_40;
  uint16_t local_12;
  server_interface<MsgType> *psStack_10;
  uint16_t port_local;
  server_interface<MsgType> *this_local;
  
  this->_vptr_server_interface = (_func_int **)&PTR__server_interface_0014d3a8;
  local_12 = port;
  psStack_10 = this;
  tsqueue<blcl::net::owned_message<MsgType>_>::tsqueue(&this->incoming_messages_);
  std::
  deque<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
  ::deque(&this->connections_);
  asio::io_context::io_context(&this->context_);
  std::thread::thread(&this->ctx_thread_);
  local_44 = asio::ip::tcp::v4();
  asio::ip::basic_endpoint<asio::ip::tcp>::basic_endpoint(&local_40,&local_44,local_12);
  asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::
  basic_socket_acceptor<asio::io_context>(&this->asio_acceptor_,&this->context_,&local_40,true,0);
  this->id_counter_ = 10000;
  return;
}

Assistant:

server_interface(uint16_t port)
            : asio_acceptor_(context_, asio::ip::tcp::endpoint(asio::ip::tcp::v4(), port))
        {

        }